

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool op_load_ri(DisasContext_conflict1 *s,arg_ldst_ri *a,MemOp mop,int mem_idx)

{
  TCGContext_conflict1 *pTVar1;
  ulong uVar2;
  undefined1 extraout_AL;
  TCGv_i32 a32;
  TCGTemp *pTVar3;
  ISSInfo issinfo;
  TCGv_i32 val;
  
  pTVar1 = s->uc->tcg_ctx;
  issinfo = ISSInvalid;
  if ((a->p != 0) && (a->w == 0)) {
    issinfo = a->rt | ISSIs16Bit;
    if ((s->base).pc_next - s->pc_curr != 2) {
      issinfo = a->rt;
    }
  }
  a32 = op_addr_ri_pre(s,a);
  pTVar3 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
  val = (TCGv_i32)((long)pTVar3 - (long)pTVar1);
  gen_aa32_ld_i32(s,val,a32,mem_idx,s->be_data | mop);
  disas_set_da_iss(s,mop,issinfo);
  op_addr_ri_post(s,a,a32,0);
  if ((a->rt == 0xf) && ((s->features & 0x8000) != 0)) {
    pTVar1 = s->uc->tcg_ctx;
    (s->base).is_jmp = DISAS_TARGET_0;
    tcg_gen_andi_i32_aarch64(pTVar1,pTVar1->cpu_R[0xf],val,-2);
    tcg_gen_andi_i32_aarch64(pTVar1,val,val,1);
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i32,(TCGArg)(val + (long)pTVar1),
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),0x220);
    tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(val + (long)pTVar1));
    uVar2 = s->features;
    if (((uVar2 >> 0x25 & 1) != 0) ||
       ((((uint)uVar2 >> 9 & 1) != 0 && (s->v7m_handler_mode != false)))) {
      (s->base).is_jmp = DISAS_TARGET_8;
    }
    return SUB81(uVar2,0);
  }
  store_reg(s,a->rt,val);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_load_ri(DisasContext *s, arg_ldst_ri *a,
                       MemOp mop, int mem_idx)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    ISSInfo issinfo = make_issinfo(s, a->rt, a->p, a->w);
    TCGv_i32 addr, tmp;

    addr = op_addr_ri_pre(s, a);

    tmp = tcg_temp_new_i32(tcg_ctx);
    gen_aa32_ld_i32(s, tmp, addr, mem_idx, mop | s->be_data);
    disas_set_da_iss(s, mop, issinfo);

    /*
     * Perform base writeback before the loaded value to
     * ensure correct behavior with overlapping index registers.
     */
    op_addr_ri_post(s, a, addr, 0);
    store_reg_from_load(s, a->rt, tmp);
    return true;
}